

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O0

int32_t __thiscall
icu_63::DayPeriodRules::getStartHourForDayPeriod
          (DayPeriodRules *this,DayPeriod dayPeriod,UErrorCode *errorCode)

{
  UBool UVar1;
  int local_30;
  int local_2c;
  int32_t i_1;
  int32_t i;
  UErrorCode *errorCode_local;
  DayPeriod dayPeriod_local;
  DayPeriodRules *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (dayPeriod == DAYPERIOD_MIDNIGHT) {
      this_local._4_4_ = 0;
    }
    else if (dayPeriod == DAYPERIOD_NOON) {
      this_local._4_4_ = 0xc;
    }
    else {
      if ((this->fDayPeriodForHour[0] == dayPeriod) && (this->fDayPeriodForHour[0x17] == dayPeriod))
      {
        for (local_2c = 0x16; 0 < local_2c; local_2c = local_2c + -1) {
          if (this->fDayPeriodForHour[local_2c] != dayPeriod) {
            return local_2c + 1;
          }
        }
      }
      else {
        for (local_30 = 0; local_30 < 0x18; local_30 = local_30 + 1) {
          if (this->fDayPeriodForHour[local_30] == dayPeriod) {
            return local_30;
          }
        }
      }
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = -1;
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int32_t DayPeriodRules::getStartHourForDayPeriod(
        DayPeriodRules::DayPeriod dayPeriod, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) { return -1; }

    if (dayPeriod == DAYPERIOD_MIDNIGHT) { return 0; }
    if (dayPeriod == DAYPERIOD_NOON) { return 12; }

    if (fDayPeriodForHour[0] == dayPeriod && fDayPeriodForHour[23] == dayPeriod) {
        // dayPeriod wraps around midnight. Start hour is later than end hour.
        for (int32_t i = 22; i >= 1; --i) {
            if (fDayPeriodForHour[i] != dayPeriod) {
                return (i + 1);
            }
        }
    } else {
        for (int32_t i = 0; i <= 23; ++i) {
            if (fDayPeriodForHour[i] == dayPeriod) {
                return i;
            }
        }
    }

    // dayPeriod doesn't exist in rule set; set error and exit.
    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
}